

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Vec_Str_t * Lms_GiaAreas(Gia_Man_t *p)

{
  char Entry;
  int iVar1;
  Vec_Str_t *p_00;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int v;
  
  p_00 = Vec_StrAlloc(p->vCos->nSize);
  v = 0;
  while( true ) {
    if (p->vCos->nSize <= v) {
      return p_00;
    }
    pGVar2 = Gia_ManCo(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar3 = (ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
    if ((~*(uint *)(pGVar2 + -uVar3) & 0x1fffffff) == 0 || (int)*(uint *)(pGVar2 + -uVar3) < 0) {
      Entry = '\0';
    }
    else {
      iVar1 = Lms_ObjArea(pGVar2 + -uVar3);
      Entry = (char)iVar1;
    }
    Vec_StrPush(p_00,Entry);
    v = v + 1;
  }
  return p_00;
}

Assistant:

Vec_Str_t * Lms_GiaAreas( Gia_Man_t * p )
{
    Vec_Str_t * vAreas;
    Gia_Obj_t * pObj;
    int i;
    vAreas = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vAreas, (char)(Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) ? Lms_ObjArea(Gia_ObjFanin0(pObj)) : 0) );
    return vAreas;
}